

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O2

void __thiscall ChronoTest_FormatDefault_Test::TestBody(ChronoTest_FormatDefault_Test *this)

{
  duration<long,_std::ratio<1L,_1L>_> *in_RCX;
  duration<int,_std::ratio<1L,_1000000000000000000L>_> *args;
  char *pcVar1;
  duration<int,_std::ratio<10L,_1L>_> *args_00;
  char *pcVar2;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,in_RCX);
  args = (duration<int,_std::ratio<1L,_1000000000000000000L>_> *)0x144993;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42s\"","fmt::format(\"{}\", std::chrono::seconds(42))",
             (char (*) [4])0x144993,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args = (duration<int,_std::ratio<1L,_1000000000000000000L>_> *)0x35;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x35,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,1000000000000000000l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,args);
  pcVar1 = "42as";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42as\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::atto>(42))",(char (*) [5])"42as",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x37;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,1000000000000000l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1L,_1000000000000000L>_> *)pcVar1);
  pcVar1 = "42fs";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42fs\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::femto>(42))",(char (*) [5])"42fs",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x39;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,1000000000000l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1L,_1000000000000L>_> *)pcVar1);
  pcVar1 = "42ps";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42ps\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::pico>(42))",(char (*) [5])"42ps",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x3b;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)pcVar1);
  pcVar1 = "42ns";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42ns\"","fmt::format(\"{}\", std::chrono::nanoseconds(42))",
             (char (*) [5])"42ns",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x3c;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<long,_std::ratio<1L,_1000000L>_> *)pcVar1);
  pcVar1 = anon_var_dwarf_9e3f;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,anon_var_dwarf_9e13,
             "fmt::format(\"{}\", std::chrono::microseconds(42))",&anon_var_dwarf_9e3f,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x3d;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1000l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<long,_std::ratio<1L,_1000L>_> *)pcVar1);
  pcVar1 = "42ms";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42ms\"","fmt::format(\"{}\", std::chrono::milliseconds(42))",
             (char (*) [5])"42ms",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x3e;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,100l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1L,_100L>_> *)pcVar1);
  pcVar1 = "42cs";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42cs\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::centi>(42))",(char (*) [5])"42cs",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x40;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1l,10l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1L,_10L>_> *)pcVar1);
  pcVar1 = "42ds";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42ds\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::deci>(42))",(char (*) [5])"42ds",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x42;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<1l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<long,_std::ratio<1L,_1L>_> *)pcVar1);
  args_00 = (duration<int,_std::ratio<10L,_1L>_> *)0x144993;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42s\"","fmt::format(\"{}\", std::chrono::seconds(42))",
             (char (*) [4])0x144993,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_00 = (duration<int,_std::ratio<10L,_1L>_> *)0x43;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<10l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,args_00);
  pcVar1 = "42das";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42das\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::deca>(42))",(char (*) [6])"42das",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x45;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<100l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<100L,_1L>_> *)pcVar1);
  pcVar1 = "42hs";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42hs\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::hecto>(42))",(char (*) [5])"42hs",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x47;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1000L,_1L>_> *)pcVar1);
  pcVar1 = "42ks";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42ks\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::kilo>(42))",(char (*) [5])"42ks",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x49;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1000000L,_1L>_> *)pcVar1);
  pcVar1 = "42Ms";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42Ms\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::mega>(42))",(char (*) [5])"42Ms",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x4b;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1000000000L,_1L>_> *)pcVar1);
  pcVar1 = "42Gs";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42Gs\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::giga>(42))",(char (*) [5])"42Gs",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x4d;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000000l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1000000000000L,_1L>_> *)pcVar1);
  pcVar1 = "42Ts";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42Ts\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::tera>(42))",(char (*) [5])"42Ts",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x4f;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000000000l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1000000000000000L,_1L>_> *)pcVar1);
  pcVar1 = "42Ps";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42Ps\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::peta>(42))",(char (*) [5])"42Ps",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x51;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<1000000000000000000l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<1000000000000000000L,_1L>_> *)pcVar1);
  pcVar1 = "42Es";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42Es\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::exa>(42))",(char (*) [5])"42Es",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x53;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<60l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<long,_std::ratio<60L,_1L>_> *)pcVar1);
  pcVar1 = "42m";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42m\"","fmt::format(\"{}\", std::chrono::minutes(42))",
             (char (*) [4])"42m",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x54;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_ = (AssertHelperData *)0x2a;
  fmt::v5::format<char[3],std::chrono::duration<long,std::ratio<3600l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<long,_std::ratio<3600L,_1L>_> *)pcVar1);
  pcVar1 = "42h";
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42h\"","fmt::format(\"{}\", std::chrono::hours(42))",
             (char (*) [4])"42h",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x55;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<15l,1l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<15L,_1L>_> *)pcVar1);
  pcVar1 = "42[15]s";
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42[15]s\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::ratio<15, 1>>(42))",
             (char (*) [8])"42[15]s",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x58;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40.data_._0_4_ = 0x2a;
  fmt::v5::format<char[3],std::chrono::duration<int,std::ratio<15l,4l>>>
            (&local_28,(v5 *)0x146ca0,(char (*) [3])&local_40,
             (duration<int,_std::ratio<15L,_4L>_> *)pcVar1);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42[15/4]s\"",
             "fmt::format(\"{}\", std::chrono::duration<int, std::ratio<15, 4>>(42))",
             (char (*) [10])"42[15/4]s",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ChronoTest, FormatDefault) {
  EXPECT_EQ("42s", fmt::format("{}", std::chrono::seconds(42)));
  EXPECT_EQ("42as",
            fmt::format("{}", std::chrono::duration<int, std::atto>(42)));
  EXPECT_EQ("42fs",
            fmt::format("{}", std::chrono::duration<int, std::femto>(42)));
  EXPECT_EQ("42ps",
            fmt::format("{}", std::chrono::duration<int, std::pico>(42)));
  EXPECT_EQ("42ns", fmt::format("{}", std::chrono::nanoseconds(42)));
  EXPECT_EQ("42µs", fmt::format("{}", std::chrono::microseconds(42)));
  EXPECT_EQ("42ms", fmt::format("{}", std::chrono::milliseconds(42)));
  EXPECT_EQ("42cs",
            fmt::format("{}", std::chrono::duration<int, std::centi>(42)));
  EXPECT_EQ("42ds",
            fmt::format("{}", std::chrono::duration<int, std::deci>(42)));
  EXPECT_EQ("42s", fmt::format("{}", std::chrono::seconds(42)));
  EXPECT_EQ("42das",
            fmt::format("{}", std::chrono::duration<int, std::deca>(42)));
  EXPECT_EQ("42hs",
            fmt::format("{}", std::chrono::duration<int, std::hecto>(42)));
  EXPECT_EQ("42ks",
            fmt::format("{}", std::chrono::duration<int, std::kilo>(42)));
  EXPECT_EQ("42Ms",
            fmt::format("{}", std::chrono::duration<int, std::mega>(42)));
  EXPECT_EQ("42Gs",
            fmt::format("{}", std::chrono::duration<int, std::giga>(42)));
  EXPECT_EQ("42Ts",
            fmt::format("{}", std::chrono::duration<int, std::tera>(42)));
  EXPECT_EQ("42Ps",
            fmt::format("{}", std::chrono::duration<int, std::peta>(42)));
  EXPECT_EQ("42Es",
            fmt::format("{}", std::chrono::duration<int, std::exa>(42)));
  EXPECT_EQ("42m", fmt::format("{}", std::chrono::minutes(42)));
  EXPECT_EQ("42h", fmt::format("{}", std::chrono::hours(42)));
  EXPECT_EQ("42[15]s",
            fmt::format("{}",
                        std::chrono::duration<int, std::ratio<15, 1>>(42)));
  EXPECT_EQ("42[15/4]s",
            fmt::format("{}",
                        std::chrono::duration<int, std::ratio<15, 4>>(42)));
}